

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_integer_printString(sysbvm_context_t *context,sysbvm_tuple_t integer)

{
  _Bool _Var1;
  bool bVar2;
  size_t sStack_70;
  _Bool isNegative;
  size_t bufferSize;
  char buffer [64];
  sysbvm_stuple_t value;
  sysbvm_tuple_t integer_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isImmediate(integer);
  if (_Var1) {
    buffer._56_8_ = sysbvm_tuple_integer_decodeSmall(integer);
    sStack_70 = 0;
    bVar2 = (long)buffer._56_8_ < 0;
    if (bVar2) {
      buffer._56_8_ = -buffer._56_8_;
    }
    for (; buffer._56_8_ != 0 || sStack_70 == 0; buffer._56_8_ = (long)buffer._56_8_ / 10) {
      buffer[sStack_70 - 8] = (char)((long)buffer._56_8_ % 10) + '0';
      sStack_70 = sStack_70 + 1;
    }
    if (bVar2) {
      buffer[sStack_70 - 8] = '-';
      sStack_70 = sStack_70 + 1;
    }
    buffer[sStack_70 - 8] = '\0';
    context_local =
         (sysbvm_context_t *)
         sysbvm_string_createWithReversedString(context,sStack_70,(char *)&bufferSize);
  }
  else {
    context_local =
         (sysbvm_context_t *)
         sysbvm_string_createWithCString
                   (context,"TODO: sysbvm_integer_printString for large integer.");
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_printString(sysbvm_context_t *context, sysbvm_tuple_t integer)
{
    // Decode the small integer.
    if(sysbvm_tuple_isImmediate(integer))
    {
        sysbvm_stuple_t value = sysbvm_tuple_integer_decodeSmall(integer);
        char buffer[64];
        size_t bufferSize = 0;

        // Work with positive integers.
        bool isNegative = false;
        if(value < 0)
        {
            isNegative = true;
            value = -value;
        }

        // Extract each one of the digits.
        while (value != 0 || bufferSize == 0)
        {
            buffer[bufferSize++] = '0' + (value % 10);
            value /= 10;
        }

        // Add the sign.
        if(isNegative)
            buffer[bufferSize++] = '-';
        buffer[bufferSize] = 0;
        return sysbvm_string_createWithReversedString(context, bufferSize, buffer);
    }

    return sysbvm_string_createWithCString(context, "TODO: sysbvm_integer_printString for large integer.");
}